

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O3

void HFSubWorker::workerthreadController(zsock_t *pipe,void *args)

{
  zsock_t *self;
  zloop_t *self_00;
  zloop_t *loop;
  zsock_t *pull;
  zloop_t *local_40;
  zsock_t *local_38;
  
  zsock_signal(pipe,'\0');
  self = zsock_new_checked(7,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/highfreqclasses.cpp"
                           ,0x1a6);
  local_38 = self;
  zsock_connect(self,*(char **)((long)args + 0xc0),0);
  self_00 = zloop_new();
  local_40 = self_00;
  zloop_reader(self_00,self,pulltocallback,args);
  zloop_reader(self_00,pipe,HighFreqSub::pipeController,args);
  zloop_start(self_00);
  zsock_destroy_checked
            (&local_38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/highfreqclasses.cpp"
             ,0x1ac);
  zloop_destroy(&local_40);
  return;
}

Assistant:

void HFSubWorker::workerthreadController(zsock_t *pipe, void *args){
    zsock_signal(pipe, 0);
    HFSubWorker *self = (HFSubWorker*)args;
    zsock_t *pull = zsock_new(ZMQ_PULL);
    zsock_connect(pull, self->pullendpoint.c_str(), NULL);
    zloop_t *loop = zloop_new();
    zloop_reader(loop, pull, pulltocallback, self);
    zloop_reader(loop, pipe, pipeController, self);
    zloop_start(loop);
    zsock_destroy(&pull);
    zloop_destroy(&loop);
}